

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::adjust_spec_diffusion_fluxes(PeleLM *this,MultiFab **flux,MultiFab *S,BCRec *bc)

{
  undefined8 *puVar1;
  long lVar2;
  ostringstream *this_00;
  int iVar3;
  int iVar4;
  EBCellFlagFab *this_01;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  pointer pBVar16;
  pointer pBVar17;
  undefined8 uVar18;
  double *pdVar19;
  Long LVar20;
  Long LVar21;
  Long LVar22;
  Long LVar23;
  Long LVar24;
  Long LVar25;
  int n_1;
  FabType FVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  BoxArray *pBVar30;
  int *piVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  ostream *poVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__return_storage_ptr__;
  long lVar57;
  FabArray<amrex::FArrayBox> *this_02;
  long lVar58;
  bool bVar59;
  double dVar60;
  double dVar61;
  undefined1 auVar62 [16];
  double dVar64;
  double dVar65;
  undefined1 auVar66 [16];
  int id_l [3];
  double *local_a50;
  double *local_a40;
  long local_a38;
  long local_a20;
  double *local_a18;
  Box local_9f4;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_9d8;
  FabArray<amrex::FArrayBox> *local_9b8;
  long local_9b0;
  long local_9a8;
  long local_9a0;
  long local_998;
  double *local_990;
  long local_988;
  double *local_980;
  ulong local_978;
  long local_970;
  long local_968;
  ulong local_960;
  uint local_954;
  int local_950;
  int local_94c [3];
  long *local_940;
  BCRec *local_938;
  long local_930;
  Box bx;
  int id_l_1 [3];
  undefined4 uStack_8f4;
  long local_8f0;
  long lStack_8e8;
  long local_8e0;
  int iStack_8d8;
  int iStack_8d4;
  int iStack_8d0;
  undefined8 uStack_8cc;
  undefined1 local_818 [48];
  int iStack_7e8;
  int iStack_7e4;
  int iStack_7e0;
  Box result;
  int local_7b0;
  int iStack_7ac;
  int local_770;
  int iStack_76c;
  long local_750;
  undefined8 uStack_748;
  long local_740;
  undefined4 uStack_738;
  int aiStack_734 [9];
  long local_710;
  long lStack_708;
  undefined1 local_700 [16];
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int iStack_6e0;
  int iStack_6dc;
  int iStack_6d8;
  int aiStack_6d0 [4];
  int iStack_6c0;
  int iStack_6bc;
  IndexType IStack_6b8;
  undefined1 local_6b4 [6] [16];
  Array4<double> local_648;
  Array4<const_double> local_608;
  MFIter mfi;
  double local_568 [22];
  undefined1 local_4b8 [384];
  MultiFab local_338;
  MultiFab local_1b8;
  long lVar63;
  
  local_938 = bc;
  dVar60 = amrex::ParallelDescriptor::second();
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x1f8);
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_start + 0x15;
  lVar38 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar38);
    *puVar1 = 0xfffffd66fffffd66;
    puVar1[1] = 0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)(local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start)->bc + lVar38 + 0x10) = 0xfffffd66fffffd66;
    lVar38 = lVar38 + 0x18;
  } while (lVar38 != 0x1f8);
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start + 0x15;
  __return_storage_ptr__ = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_4b8;
  NavierStokesBase::fetchBCArray
            (__return_storage_ptr__,&this->super_NavierStokesBase,0,first_spec,0x15);
  pBVar17 = local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pBVar16 = local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_4b8._0_8_;
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_4b8._8_8_;
  local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_4b8._16_8_;
  local_4b8._0_16_ = (undefined1  [16])0x0;
  local_4b8._16_8_ = (pointer)0x0;
  local_9b8 = &S->super_FabArray<amrex::FArrayBox>;
  if (pBVar16 != (pointer)0x0) {
    operator_delete(pBVar16,(long)pBVar17 - (long)pBVar16);
    if ((pointer)local_4b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ - local_4b8._0_8_);
    }
  }
  lVar38 = 0;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)(local_4b8 + lVar38));
    lVar38 = lVar38 + 0x180;
  } while (lVar38 != 0x480);
  lVar38 = 0;
  do {
    pBVar30 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)this,(int)lVar38);
    result.smallend.vect[0] = 1;
    result.smallend.vect[1] = 0;
    result.btype.itype = 0;
    result.smallend.vect[2] = 0;
    result.bigend.vect[0] = 0;
    result.bigend.vect[1] = 0;
    result.bigend.vect[2] = 0;
    (**(code **)(((__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                  ).super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start)->bc + 4))
              (__return_storage_ptr__,pBVar30,&(this->super_NavierStokesBase).super_AmrLevel.dmap,
               0x15,4,&result,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(result.bigend.vect + 1));
    this_02 = local_9b8;
    lVar38 = lVar38 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 0x10;
  } while (lVar38 != 3);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            ((MultiFab *)local_9b8,(MultiFab *)local_4b8,&local_338,&local_1b8,1,0,0x15,
             &(this->super_NavierStokesBase).super_AmrLevel.geom,&local_9d8);
  amrex::MFIter::MFIter(&mfi,&this_02->super_FabArrayBase,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_940 = &local_750;
    lVar38 = 0;
    do {
      do {
        uVar29 = (uint)lVar38;
        amrex::MFIter::nodaltilebox(&local_9f4,&mfi,uVar29);
        uVar7 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect + 2);
        uVar8 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 2);
        bx.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)
                           (this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect >>
                  0x20);
        bx.bigend.vect[2] = (int)uVar8;
        bx.btype.itype = SUB84(uVar8,4);
        uVar18 = bx._20_8_;
        bx.smallend.vect._0_8_ =
             *(undefined8 *)(this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect;
        bx.smallend.vect[2] = (int)uVar7;
        bx.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
        bx.btype.itype = SUB84(uVar8,4);
        uVar27 = bx.btype.itype >> (uVar29 & 0x1f);
        bx._20_8_ = uVar18;
        if ((uVar27 & 1) == 0) {
          piVar31 = bx.bigend.vect + lVar38;
          *piVar31 = *piVar31 + 1;
          bx.btype.itype = bx.btype.itype | 1 << ((byte)lVar38 & 0x1f);
        }
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_608,this_02,&mfi,1);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_648,&flux[lVar38]->super_FabArray<amrex::FArrayBox>,&mfi);
        piVar31 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar31 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        this_01 = (EBCellFlagFab *)
                  (this_02->m_fabs_v).
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[*piVar31][1].super_BaseFab<double>.
                  _vptr_BaseFab;
        result.smallend.vect[1] = local_9f4.smallend.vect[1];
        result.smallend.vect[0] = local_9f4.smallend.vect[0];
        result.bigend.vect[1] = local_9f4.bigend.vect[1];
        result.bigend.vect[2] = local_9f4.bigend.vect[2];
        result.btype.itype = local_9f4.btype.itype;
        result.smallend.vect[2] = local_9f4.smallend.vect[2];
        result.bigend.vect[0] = local_9f4.bigend.vect[0];
        FVar26 = amrex::EBCellFlagFab::getType(this_01,&result);
        if (FVar26 != covered) {
          result.smallend.vect[0] = local_9f4.smallend.vect[0] + -4;
          result.smallend.vect[1] = local_9f4.smallend.vect[1] - 4;
          result.smallend.vect[2] = local_9f4.smallend.vect[2] - 4;
          result.bigend.vect[0] = local_9f4.bigend.vect[0] + 4;
          result.bigend.vect[1] = local_9f4.bigend.vect[1] + 4;
          result.bigend.vect[2] = local_9f4.bigend.vect[2] + 4;
          FVar26 = amrex::EBCellFlagFab::getType(this_01,&result);
          iVar3 = local_608.begin.z;
          uVar7 = local_608.begin._0_8_;
          LVar25 = local_608.nstride;
          LVar24 = local_608.kstride;
          LVar23 = local_608.jstride;
          pdVar56 = local_608.p;
          iVar51 = local_648.begin.z;
          LVar22 = local_648.nstride;
          LVar21 = local_648.kstride;
          LVar20 = local_648.jstride;
          pdVar19 = local_648.p;
          iVar15 = local_9f4.bigend.vect[2];
          iVar14 = local_9f4.bigend.vect[1];
          iVar13 = local_9f4.bigend.vect[0];
          iVar12 = local_9f4.smallend.vect[1];
          iVar11 = local_9f4.smallend.vect[0];
          if (FVar26 == regular) {
            result.smallend.vect[0] = uVar29;
            result.btype.itype = (uint)local_608.kstride;
            result.smallend.vect[2] = (int)local_608.p;
            result.bigend.vect[0] = (int)((ulong)local_608.p >> 0x20);
            result.bigend.vect[1] = (int)local_608.jstride;
            result.bigend.vect[2] = (int)((ulong)local_608.jstride >> 0x20);
            local_770 = local_648.begin.x;
            iStack_76c = local_648.begin.y;
            *(ulong *)((long)local_940 + 0xc) = CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]);
            *(undefined8 *)((long)local_940 + 0x14) = bx._20_8_;
            *local_940 = bx.smallend.vect._0_8_;
            local_940[1] = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
            aiStack_734._16_8_ = *(undefined8 *)(local_938->bc + 4);
            aiStack_734[0] = (int)*(undefined8 *)local_938->bc;
            aiStack_734[1] = (int)((ulong)*(undefined8 *)local_938->bc >> 0x20);
            aiStack_734._8_8_ = *(undefined8 *)(local_938->bc + 2);
            this_02 = local_9b8;
            if (local_9f4.smallend.vect[2] <= local_9f4.bigend.vect[2]) {
              local_7b0 = (int)uVar7;
              iStack_7ac = SUB84(uVar7,4);
              local_978 = CONCAT44(local_978._4_4_,iStack_7ac);
              local_980 = pdVar56 + -(long)local_7b0;
              local_988 = LVar23 << 3;
              local_990 = (double *)(LVar24 << 3);
              local_9b0 = LVar21 << 3;
              local_9a8 = -(long)iStack_76c;
              local_998 = (long)iVar3;
              uVar27 = local_9f4.smallend.vect[2];
              do {
                if (iVar12 <= iVar14) {
                  local_9a0 = (long)pdVar19 +
                              ((long)(int)uVar27 - (long)iVar51) * local_9b0 + (long)local_770 * -8;
                  uVar29 = iVar12;
                  do {
                    uVar50 = uVar29;
                    if (iVar11 <= iVar13) {
                      local_968 = ((int)uVar29 + local_9a8) * LVar20 * 8 + local_9a0;
                      local_970 = CONCAT44(local_970._4_4_,aiStack_734[lVar38]);
                      iVar3 = aiStack_734[lVar38 + 3];
                      local_960 = (ulong)uVar29;
                      iVar6 = iVar11;
                      do {
                        id_l[0] = iVar6;
                        iVar49 = (int)local_960;
                        id_l[1] = iVar49;
                        id_l[2] = uVar27;
                        iVar37 = iVar6;
                        uVar29 = uVar27;
                        id_l_1[0] = iVar6;
                        id_l_1[1] = iVar49;
                        id_l_1[2] = uVar27;
                        if ((int)local_970 == 3) {
                          iVar28 = id_l[lVar38];
                          iVar4 = *(int *)((long)&local_750 + lVar38 * 4);
                          bVar59 = iVar28 <= iVar4;
                          if (iVar3 == 3) {
LAB_00284c69:
                            local_818._0_4_ = iVar6;
                            local_818._4_4_ = iVar49;
                            local_818._8_4_ = uVar27;
                            if (!bVar59) {
                              if (iVar28 < *(int *)((long)&uStack_748 + lVar38 * 4 + 4))
                              goto LAB_00284ced;
                              goto LAB_00284cfc;
                            }
                          }
                          else {
                            local_818._0_4_ = iVar6;
                            local_818._4_4_ = iVar49;
                            local_818._8_4_ = uVar27;
                            if (iVar4 < iVar28) goto LAB_00284ced;
                          }
                          local_818._0_4_ = iVar6;
                          local_818._4_4_ = iVar49;
                          local_818._8_4_ = uVar27;
                          id_l_1[lVar38] = id_l_1[lVar38] + -1;
                          *(int *)(local_818 + lVar38 * 4) = *(int *)(local_818 + lVar38 * 4) + -1;
                          iVar37 = local_818._0_4_;
                          iVar49 = local_818._4_4_;
                          uVar29 = local_818._8_4_;
                        }
                        else {
                          if (iVar3 == 3) {
                            iVar28 = id_l[lVar38];
                            bVar59 = false;
                            goto LAB_00284c69;
                          }
LAB_00284ced:
                          id_l_1[lVar38] = id_l_1[lVar38] + -1;
                        }
LAB_00284cfc:
                        pdVar56 = (double *)(local_968 + (long)iVar6 * 8);
                        pdVar47 = (double *)(local_968 + (long)iVar6 * 8);
                        memset(local_568,0,0xa8);
                        dVar64 = 0.0;
                        lVar46 = 0;
                        dVar61 = 0.0;
                        pdVar43 = local_980;
                        do {
                          dVar61 = dVar61 + *pdVar47;
                          dVar65 = (*(double *)
                                     ((long)pdVar43 +
                                     (id_l_1[2] - local_998) * (long)local_990 +
                                     (id_l_1[1] - (int)local_978) * local_988 + (long)id_l_1[0] * 8)
                                   + *(double *)
                                      ((long)pdVar43 +
                                      ((int)uVar29 - local_998) * (long)local_990 +
                                      (iVar49 - (int)local_978) * local_988 + (long)iVar37 * 8)) *
                                   0.5;
                          local_568[lVar46] = dVar65;
                          dVar64 = dVar64 + dVar65;
                          lVar46 = lVar46 + 1;
                          pdVar43 = pdVar43 + LVar25;
                          pdVar47 = pdVar47 + LVar22;
                        } while (lVar46 != 0x15);
                        lVar46 = 0;
                        do {
                          *pdVar56 = local_568[lVar46] * -dVar61 * (1.0 / dVar64) + *pdVar56;
                          lVar46 = lVar46 + 1;
                          pdVar56 = pdVar56 + LVar22;
                        } while (lVar46 != 0x15);
                        bVar59 = iVar6 != iVar13;
                        uVar50 = (uint)local_960;
                        iVar6 = iVar6 + 1;
                      } while (bVar59);
                    }
                    uVar29 = uVar50 + 1;
                  } while (uVar50 != iVar14);
                }
                bVar59 = uVar27 != iVar15;
                this_02 = local_9b8;
                uVar27 = uVar27 + 1;
              } while (bVar59);
            }
          }
          else {
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)id_l_1,
                       (FabArray<amrex::FArrayBox> *)(local_4b8 + lVar38 * 0x180),&mfi);
            amrex::MultiCutFab::array
                      ((Array4<const_double> *)local_818,
                       (this->super_NavierStokesBase).areafrac._M_elems[lVar38],&mfi);
            iVar15 = local_608.begin.z;
            uVar7 = local_608.begin._0_8_;
            LVar25 = local_608.nstride;
            LVar24 = local_608.kstride;
            LVar23 = local_608.jstride;
            pdVar56 = local_608.p;
            iVar14 = local_648.begin.z;
            LVar22 = local_648.nstride;
            LVar21 = local_648.kstride;
            LVar20 = local_648.jstride;
            pdVar19 = local_648.p;
            iVar13 = local_9f4.bigend.vect[1];
            iVar12 = local_9f4.bigend.vect[0];
            iVar11 = local_9f4.smallend.vect[0];
            result.smallend.vect[0] = uVar29;
            result.btype.itype = (uint)local_608.kstride;
            result.smallend.vect[2] = (int)local_608.p;
            result.bigend.vect[0] = (int)((ulong)local_608.p >> 0x20);
            result.bigend.vect[1] = (int)local_608.jstride;
            result.bigend.vect[2] = (int)((ulong)local_608.jstride >> 0x20);
            local_770 = local_648.begin.x;
            iStack_76c = local_648.begin.y;
            *(ulong *)((long)local_940 + 0x2c) = CONCAT44(iStack_8d0,iStack_8d4);
            *(undefined8 *)((long)local_940 + 0x34) = uStack_8cc;
            local_940[4] = local_8e0;
            local_940[5] = CONCAT44(iStack_8d4,iStack_8d8);
            local_940[2] = local_8f0;
            local_940[3] = lStack_8e8;
            *local_940 = CONCAT44(id_l_1[1],id_l_1[0]);
            local_940[1] = CONCAT44(uStack_8f4,id_l_1[2]);
            lVar46 = CONCAT44(local_818._4_4_,local_818._0_4_);
            lVar9 = CONCAT44(local_818._12_4_,local_818._8_4_);
            iStack_6e0 = iStack_7e8;
            iStack_6dc = iStack_7e4;
            iStack_6d8 = iStack_7e0;
            local_700 = local_818._16_16_;
            auVar62 = local_700;
            local_710 = lVar46;
            lStack_708 = lVar9;
            iStack_6c0 = bx.bigend.vect[1];
            iStack_6bc = bx.bigend.vect[2];
            IStack_6b8.itype = bx.btype.itype;
            aiStack_6d0[0] = bx.smallend.vect[0];
            aiStack_6d0[1] = bx.smallend.vect[1];
            aiStack_6d0[2] = bx.smallend.vect[2];
            aiStack_6d0[3] = bx.bigend.vect[0];
            local_6b4[1]._0_8_ = *(undefined8 *)(local_938->bc + 4);
            local_6b4[0] = *(undefined1 (*) [16])local_938->bc;
            local_954 = local_9f4.bigend.vect[2];
            this_02 = local_9b8;
            if (local_9f4.smallend.vect[2] <= local_9f4.bigend.vect[2]) {
              lVar57 = (long)local_9f4.smallend.vect[1];
              lVar58 = (long)local_9f4.smallend.vect[0];
              local_7b0 = (int)uVar7;
              iStack_7ac = SUB84(uVar7,4);
              lVar53 = LVar20 * 8;
              lVar2 = (lVar57 - iStack_76c) * lVar53 + lVar58 * 8;
              lVar54 = LVar23 * 8;
              local_988 = (long)iStack_7ac;
              local_990 = pdVar56 + -(long)local_7b0;
              local_930 = lVar57;
              local_9b0 = uStack_748 * 8;
              pdVar47 = (double *)(LVar22 << 4);
              local_998 = (long)iVar15;
              lVar39 = (lVar57 - aiStack_734[2]) * uStack_748 * 8 + lVar58 * 8 +
                       (long)aiStack_734[1] * -8 + local_750;
              lVar32 = local_740 * 8;
              lVar33 = (long)aiStack_734[3];
              lVar10 = CONCAT44(aiStack_734[0],uStack_738);
              iVar51 = local_9f4.bigend.vect[0] + 1;
              local_950 = local_9f4.bigend.vect[1] + 1;
              local_6f0 = local_818._32_4_;
              lVar52 = (long)local_6f0;
              local_6ec = local_818._36_4_;
              local_6e8 = local_818._40_4_;
              local_700._0_8_ = local_818._16_8_;
              uVar7 = local_700._0_8_;
              local_9a8 = LVar25;
              local_980 = pdVar47;
              local_9a0 = lVar52;
              auVar66 = _DAT_0074fb40;
              uVar27 = local_9f4.smallend.vect[2];
              local_700 = auVar62;
              do {
                uVar45 = (ulong)uVar27;
                uVar29 = uVar27;
                if ((int)local_930 <= iVar13) {
                  lVar34 = (long)(int)uVar27;
                  local_a38 = (long)pdVar56 +
                              (lVar34 - iVar15) * LVar24 * 8 +
                              (lVar57 - iStack_7ac) * lVar54 + lVar58 * 8 + (long)local_7b0 * -8;
                  local_a50 = (double *)((lVar34 - lVar33) * lVar32 + lVar39);
                  lVar42 = (lVar34 - iVar14) * LVar21 * 8;
                  local_a20 = (long)pdVar19 + lVar42 + lVar2 + LVar22 * 8 + (long)local_770 * -8;
                  local_a18 = (double *)((long)pdVar19 + lVar42 + lVar2 + (long)local_770 * -8);
                  local_978 = uVar45;
                  lVar42 = local_930;
                  do {
                    if (iVar11 <= iVar12) {
                      local_960 = CONCAT44(local_960._4_4_,
                                           *(undefined4 *)(local_6b4[0] + lVar38 * 4));
                      local_968 = CONCAT44(local_968._4_4_,
                                           *(undefined4 *)(local_6b4[0] + lVar38 * 4 + 0xc));
                      local_970 = lVar46 + (lVar34 - local_6e8) * uVar7 * 8 +
                                  (lVar42 - local_6ec) * lVar9 * 8;
                      local_a40 = local_a50;
                      lVar41 = lVar58;
                      lVar44 = local_a38;
                      pdVar43 = local_a18;
                      lVar55 = local_a20;
                      do {
                        local_94c[0] = (int)lVar41;
                        local_94c[1] = (int)lVar42;
                        local_94c[2] = (int)uVar45;
                        if ((int)local_960 == 3) {
                          bVar59 = local_94c[lVar38] <= aiStack_6d0[lVar38];
                        }
                        else {
                          bVar59 = false;
                        }
                        if ((int)local_968 == 3) {
                          bVar5 = aiStack_6d0[lVar38 + 3] <= local_94c[lVar38];
                        }
                        else {
                          bVar5 = false;
                        }
                        id_l[0] = (int)lVar41;
                        id_l[1] = (int)lVar42;
                        id_l[2] = (int)uVar45;
                        id_l[lVar38] = id_l[lVar38] + -1;
                        if (*(double *)(local_970 + (lVar41 - lVar52) * 8) <= 0.0) {
                          lVar48 = 0x16;
                          lVar40 = 0;
                          auVar62 = _DAT_0074fb30;
                          do {
                            if (SUB164(auVar62 ^ auVar66,4) == -0x80000000 &&
                                SUB164(auVar62 ^ auVar66,0) < -0x7fffffeb) {
                              *(undefined8 *)((long)pdVar43 + lVar40) = 0;
                              *(undefined8 *)(lVar55 + lVar40) = 0;
                            }
                            lVar63 = auVar62._8_8_;
                            auVar62._0_8_ = auVar62._0_8_ + 2;
                            auVar62._8_8_ = lVar63 + 2;
                            lVar40 = lVar40 + (long)pdVar47;
                            lVar48 = lVar48 + -2;
                          } while (lVar48 != 0);
                        }
                        else {
                          memset(local_568,0,0xa8);
                          auVar66 = _DAT_0074fb40;
                          dVar64 = 0.0;
                          lVar52 = 0;
                          lVar48 = 0;
                          dVar61 = 0.0;
                          pdVar47 = pdVar43;
                          pdVar35 = local_a40;
                          do {
                            dVar61 = dVar61 + *pdVar47;
                            dVar65 = *pdVar35;
                            local_568[lVar48] = dVar65;
                            if (bVar59) {
                              dVar65 = *(double *)
                                        ((long)local_990 +
                                        lVar52 * 8 +
                                        (long)(id_l[2] - (int)local_998) * LVar24 * 8 +
                                        (id_l[1] - (int)local_988) * lVar54 + (long)id_l[0] * 8);
                              local_568[lVar48] = dVar65;
                            }
                            if (bVar5) {
                              dVar65 = *(double *)(lVar44 + lVar52 * 8);
                              local_568[lVar48] = dVar65;
                            }
                            dVar64 = dVar64 + dVar65;
                            lVar48 = lVar48 + 1;
                            lVar52 = lVar52 + local_9a8;
                            pdVar35 = pdVar35 + lVar10;
                            pdVar47 = pdVar47 + LVar22;
                          } while (lVar48 != 0x15);
                          lVar48 = 0;
                          pdVar35 = pdVar43;
                          do {
                            *pdVar35 = local_568[lVar48] * -dVar61 * (1.0 / dVar64) + *pdVar35;
                            lVar48 = lVar48 + 1;
                            pdVar35 = pdVar35 + LVar22;
                            uVar45 = local_978;
                            pdVar47 = local_980;
                            lVar52 = local_9a0;
                          } while (lVar48 != 0x15);
                        }
                        lVar41 = lVar41 + 1;
                        lVar55 = lVar55 + 8;
                        pdVar43 = pdVar43 + 1;
                        lVar44 = lVar44 + 8;
                        local_a40 = local_a40 + 1;
                      } while (iVar51 != (int)lVar41);
                    }
                    uVar29 = (uint)uVar45;
                    lVar42 = lVar42 + 1;
                    local_a20 = local_a20 + lVar53;
                    local_a18 = local_a18 + LVar20;
                    local_a38 = local_a38 + lVar54;
                    local_a50 = (double *)((long)local_a50 + local_9b0);
                  } while (local_950 != (int)lVar42);
                }
                uVar27 = uVar29 + 1;
                this_02 = local_9b8;
              } while (uVar29 != local_954);
            }
          }
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != 3);
      amrex::MFIter::operator++(&mfi);
      lVar38 = 0;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (2 < NavierStokesBase::verbose) {
    dVar61 = amrex::ParallelDescriptor::second();
    poVar36 = amrex::OutStream();
    this_00 = (ostringstream *)(result.bigend.vect + 1);
    result.smallend.vect[1] = *(int *)(DAT_00816950 + -0x48);
    result.smallend.vect[0] = *(int *)(DAT_00816950 + -0x30);
    result.smallend.vect[2] = (int)poVar36;
    result.bigend.vect[0] = (int)((ulong)poVar36 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)
     ((long)&((IndexType *)(&result.bigend + 1))->itype +
     *(long *)(CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) +
          *(long *)(*(long *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"      PeleLM::adjust_spec_diffusion_fluxes(): lev: ",0x33);
    std::ostream::operator<<(this_00,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", time: ",8);
    std::ostream::_M_insert<double>(dVar61 - dVar60);
    local_568[0]._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_568,1);
    amrex::Print::~Print((Print *)&result);
  }
  lVar38 = 0x300;
  do {
    amrex::MultiFab::~MultiFab((MultiFab *)(local_4b8 + lVar38));
    lVar38 = lVar38 + -0x180;
  } while (lVar38 != -0x180);
  if (local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_9d8.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
PeleLM::adjust_spec_diffusion_fluxes (MultiFab* const * flux,
                                      const MultiFab&   S,
                                      const BCRec&      bc)
{
   BL_PROFILE("PLM::adjust_spec_diffusion_fluxes()");
   AMREX_ASSERT(S.nGrow() >= 1);
   // Note: S first entry is rho

   //
   // Adjust the species diffusion fluxes so that their sum is zero.
   //
   const Real strt_time = ParallelDescriptor::second();
   const Box& domain = geom.Domain();

#ifdef AMREX_USE_EB
   Vector<BCRec> math_bc(NUM_SPECIES);
   math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

   MultiFab edgstate[AMREX_SPACEDIM];
   int nghost(4);         // TODO Use 4 for now

   for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
   {
     const BoxArray& ba = getEdgeBoxArray(idim);
     edgstate[idim].define(ba, dmap, NUM_SPECIES, nghost, MFInfo(), Factory());
   }
   EB_interp_CellCentroid_to_FaceCentroid(S, AMREX_D_DECL(edgstate[0],edgstate[1],edgstate[2]), 1, 0, NUM_SPECIES, geom, math_bc);
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      for (int dir =0; dir < AMREX_SPACEDIM; ++dir)
      {
         const Box& ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         auto const& rhoY     = S.const_array(mfi,1);
         auto const& flux_dir = flux[dir]->array(mfi);

#ifdef AMREX_USE_EB
         const EBFArrayBox&  state_fab = static_cast<EBFArrayBox const&>(S[mfi]);
         const EBCellFlagFab&    flags = state_fab.getEBCellFlagFab();

         if (flags.getType(amrex::grow(ebx,0)) != FabType::covered )
         {
            // No cut cells in tile + nghost-cell witdh halo -> use non-eb routine
            if (flags.getType(amrex::grow(ebx,nghost)) == FabType::regular )
            {
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
               });
            }
            else
            {
               auto const& rhoYed_d   = edgstate[dir].array(mfi);
               auto const& areafrac_d = areafrac[dir]->array(mfi);
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, rhoYed_d, areafrac_d, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux_eb( i, j, k, dir, on_lo, on_hi, rhoY, rhoYed_d, areafrac_d, flux_dir );
               });
            }
         }
#else
         amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
         });

#endif
      }
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::adjust_spec_diffusion_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}